

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O1

duckdb_value duckdb_create_decimal(duckdb_decimal input)

{
  hugeint_t value;
  bool bVar1;
  Value *__return_storage_ptr__;
  int64_t *in_RCX;
  hugeint_t input_00;
  int64_t int64;
  Hugeint *in_stack_00000010;
  uint64_t in_stack_00000018;
  int64_t local_30;
  
  value.upper = in_stack_00000018;
  value.lower = (uint64_t)in_stack_00000010;
  input_00.upper = (int64_t)&local_30;
  input_00.lower = in_stack_00000018;
  bVar1 = duckdb::Hugeint::TryCast<long>(in_stack_00000010,input_00,in_RCX);
  __return_storage_ptr__ = (Value *)operator_new(0x40);
  if (bVar1) {
    duckdb::Value::DECIMAL(__return_storage_ptr__,local_30,(uint8_t)int64,int64._1_1_);
  }
  else {
    duckdb::Value::DECIMAL(__return_storage_ptr__,value,(uint8_t)int64,int64._1_1_);
  }
  return (duckdb_value)__return_storage_ptr__;
}

Assistant:

duckdb_value duckdb_create_decimal(duckdb_decimal input) {
	duckdb::hugeint_t hugeint(input.value.upper, input.value.lower);
	int64_t int64;
	if (duckdb::Hugeint::TryCast<int64_t>(hugeint, int64)) {
		// The int64 DECIMAL value constructor will select the appropriate physical type based on width.
		return WrapValue(new duckdb::Value(duckdb::Value::DECIMAL(int64, input.width, input.scale)));
	} else {
		// The hugeint DECIMAL value constructor always uses a physical hugeint, and requires width >= MAX_WIDTH_INT64.
		return WrapValue(new duckdb::Value(duckdb::Value::DECIMAL(hugeint, input.width, input.scale)));
	}
}